

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test.c
# Opt level: O1

int test_typed_empty_monster(flatcc_builder_t *B)

{
  flatcc_builder_ref_t fVar1;
  int iVar2;
  int iVar3;
  flatcc_builder_ref_t *pfVar4;
  void *addr;
  char *pcVar5;
  char *__format;
  size_t size;
  flatbuffers_fid_t fid;
  size_t local_28;
  char local_1c [4];
  
  local_1c[0] = '\0';
  local_1c[1] = '\0';
  local_1c[2] = '\0';
  local_1c[3] = '\0';
  flatcc_builder_reset(B);
  flatcc_builder_start_buffer(B,anon_var_dwarf_1bb,0,0);
  flatcc_builder_start_table(B,0x24);
  fVar1 = flatcc_builder_create_string_str(B,"MyMonster");
  if (fVar1 != 0) {
    pfVar4 = flatcc_builder_table_add_offset(B,3);
    if (pfVar4 != (flatcc_builder_ref_t *)0x0) {
      *pfVar4 = fVar1;
    }
  }
  iVar2 = flatcc_builder_check_required(B,__MyGame_Example_Monster_required,1);
  if (iVar2 == 0) {
    __assert_fail("flatcc_builder_check_required(B, __MyGame_Example_Monster_required, sizeof(__MyGame_Example_Monster_required) / sizeof(__MyGame_Example_Monster_required[0]) - 1)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O1/test/monster_test/generated/monster_test_builder.h"
                  ,0x149,
                  "MyGame_Example_Monster_ref_t MyGame_Example_Monster_end(flatbuffers_builder_t *)"
                 );
  }
  fVar1 = flatcc_builder_end_table(B);
  flatcc_builder_end_buffer(B,fVar1);
  addr = flatcc_builder_finalize_aligned_buffer(B,&local_28);
  hexdump("empty typed monster table",addr,local_28,_stderr);
  if (*(int *)((long)addr + 4) == 0x330ef481) {
    iVar2 = verify_empty_monster(addr);
    if (iVar2 != 0) {
      iVar2 = flatcc_verify_table_as_root
                        (addr,local_28,anon_var_dwarf_1bb,MyGame_Example_Monster_verify_table);
      if (iVar2 == 0) {
        iVar2 = flatcc_verify_table_as_root
                          (addr,local_28,anon_var_dwarf_1bb,MyGame_Example_Monster_verify_table);
        if (iVar2 != 0) goto LAB_00104e93;
        iVar2 = flatcc_verify_table_as_typed_root
                          (addr,local_28,0x330ef481,MyGame_Example_Monster_verify_table);
        if (iVar2 == 0) {
          iVar2 = flatcc_verify_table_as_typed_root
                            (addr,local_28,0x330ef481,MyGame_Example_Monster_verify_table);
          if (iVar2 == 0) {
            local_1c[0] = -0x7f;
            local_1c[1] = -0xc;
            local_1c[2] = '\x0e';
            local_1c[3] = '3';
            iVar2 = flatcc_verify_table_as_root
                              (addr,local_28,local_1c,MyGame_Example_Monster_verify_table);
            if (iVar2 == 0) {
              iVar3 = flatcc_verify_table_as_root
                                (addr,local_28,"MONS",MyGame_Example_Monster_verify_table);
              iVar2 = 0;
              if (iVar3 == 0) {
                puts("should not have verified with the original identifier since we use types");
              }
              goto LAB_00104ed0;
            }
            goto LAB_00104e93;
          }
          pcVar5 = flatcc_verify_error_string(iVar2);
          __format = "could not verify empty monster with explicit type hash, got %s\n";
        }
        else {
          pcVar5 = flatcc_verify_error_string(iVar2);
          __format = "could not verify empty monster with type hash, got %s\n";
        }
      }
      else {
LAB_00104e93:
        pcVar5 = flatcc_verify_error_string(iVar2);
        __format = "could not verify typed empty monster, got %s\n";
      }
      printf(__format,pcVar5);
      goto LAB_00104ed0;
    }
    puts("typed empty monster should not verify with default identifier");
  }
  else {
    printf("Monster does not have the expected type, got %lx\n");
  }
  iVar2 = -1;
LAB_00104ed0:
  flatcc_builder_aligned_free(addr);
  return iVar2;
}

Assistant:

int test_typed_empty_monster(flatcc_builder_t *B)
{
    int ret = -1;
    ns(Monster_ref_t) root;
    void *buffer;
    size_t size;
    flatbuffers_fid_t fid = { 0 };

    flatcc_builder_reset(B);

    flatbuffers_buffer_start(B, ns(Monster_type_identifier));
    ns(Monster_start(B));
    /* Cannot make monster empty as name is required. */
    ns(Monster_name_create_str(B, "MyMonster"));
    root = ns(Monster_end(B));
    flatbuffers_buffer_end(B, root);


    buffer = flatcc_builder_finalize_aligned_buffer(B, &size);

    hexdump("empty typed monster table", buffer, size, stderr);

    if (flatbuffers_get_type_hash(buffer) != flatbuffers_type_hash_from_name("MyGame.Example.Monster")) {

        printf("Monster does not have the expected type, got %lx\n", (unsigned long)flatbuffers_get_type_hash(buffer));
        goto done;
    }

    if (!flatbuffers_has_type_hash(buffer, ns(Monster_type_hash))) {
        printf("Monster does not have the expected type\n");
        goto done;
    }
    if (!flatbuffers_has_type_hash(buffer, 0x330ef481)) {
        printf("Monster does not have the expected type\n");
        goto done;
    }

    if (!verify_empty_monster(buffer)) {
        printf("typed empty monster should not verify with default identifier\n");
        goto done;
    }

    if ((ret = ns(Monster_verify_as_root_with_identifier(buffer, size, ns(Monster_type_identifier))))) {
        printf("could not verify typed empty monster, got %s\n", flatcc_verify_error_string(ret));
        goto done;
    }

    if ((ret = ns(Monster_verify_as_typed_root(buffer, size)))) {
        printf("could not verify typed empty monster, got %s\n", flatcc_verify_error_string(ret));
        goto done;
    }

    if ((ret = ns(Monster_verify_as_root_with_type_hash(buffer, size, ns(Monster_type_hash))))) {
        printf("could not verify empty monster with type hash, got %s\n", flatcc_verify_error_string(ret));
        goto done;
    }

    if ((ret = ns(Monster_verify_as_root_with_type_hash(buffer, size, flatbuffers_type_hash_from_name("MyGame.Example.Monster"))))) {
        printf("could not verify empty monster with explicit type hash, got %s\n", flatcc_verify_error_string(ret));
        goto done;
    }

    flatbuffers_identifier_from_type_hash(0x330ef481, fid);
    if ((ret = ns(Monster_verify_as_root_with_identifier(buffer, size, fid)))) {
        printf("could not verify typed empty monster, got %s\n", flatcc_verify_error_string(ret));
        goto done;
    }

    if (!ns(Monster_verify_as_root(buffer, size))) {
        printf("should not have verified with the original identifier since we use types\n");
        goto done;
    }
    ret = 0;

done:
    flatcc_builder_aligned_free(buffer);
    return ret;
}